

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

ON_ModelComponentWeakReference __thiscall
ONX_ModelComponentIterator::PreviousComponentWeakReference(ONX_ModelComponentIterator *this)

{
  SN_ELEMENT *pSVar1;
  ON__UINT64 OVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ONX_ModelComponentIterator *in_RSI;
  ON_ModelComponentReference *src;
  ONX_ModelComponentReferenceLink *link;
  ON_ModelComponentWeakReference OVar4;
  
  if (in_RSI->m_list == (ONX_ModelComponentList *)0x0) {
    LastComponentReference((ONX_ModelComponentIterator *)&stack0xffffffffffffffd8);
    ON_ModelComponentWeakReference::ON_ModelComponentWeakReference
              ((ON_ModelComponentWeakReference *)this,
               (ON_ModelComponentReference *)&stack0xffffffffffffffd8);
    ON_ModelComponentReference::~ON_ModelComponentReference
              ((ON_ModelComponentReference *)&stack0xffffffffffffffd8);
    _Var3._M_pi = extraout_RDX;
    goto LAB_0046b844;
  }
  if (in_RSI->m_link == (ONX_ModelComponentReferenceLink *)0x0) {
    ON_ModelComponentWeakReference::ON_ModelComponentWeakReference
              ((ON_ModelComponentWeakReference *)this,&ON_ModelComponentReference::Empty);
    _Var3._M_pi = extraout_RDX_00;
    goto LAB_0046b844;
  }
  if (in_RSI->m_model_content_version == in_RSI->m_model->m_private->m_model_content_version_number)
  {
    src = &in_RSI->m_link->m_prev->m_mcr;
    in_RSI->m_link = (ONX_ModelComponentReferenceLink *)src;
    if ((ONX_ModelComponentReferenceLink *)src == (ONX_ModelComponentReferenceLink *)0x0) {
      in_RSI->m_next_component_sn = in_RSI->m_current_component_sn;
      in_RSI->m_current_component_sn = 0;
      in_RSI->m_prev_component_sn = 0;
      ON_ModelComponentWeakReference::operator=
                (&in_RSI->m_current_component_weak_ref,&ON_ModelComponentWeakReference::Empty);
    }
    else {
      in_RSI->m_current_component_sn = ((ONX_ModelComponentReferenceLink *)src)->m_sn;
      if (((ONX_ModelComponentReferenceLink *)src)->m_next == (ONX_ModelComponentReferenceLink *)0x0
         ) {
        OVar2 = 0;
      }
      else {
        OVar2 = ((ONX_ModelComponentReferenceLink *)src)->m_next->m_sn;
      }
      in_RSI->m_next_component_sn = OVar2;
      if (((ONX_ModelComponentReferenceLink *)src)->m_prev == (ONX_ModelComponentReferenceLink *)0x0
         ) {
        OVar2 = 0;
      }
      else {
        OVar2 = ((ONX_ModelComponentReferenceLink *)src)->m_prev->m_sn;
      }
      in_RSI->m_prev_component_sn = OVar2;
LAB_0046b830:
      ON_ModelComponentWeakReference::operator=(&in_RSI->m_current_component_weak_ref,src);
    }
  }
  else {
    if (in_RSI->m_prev_component_sn == 0) {
      in_RSI->m_link = (ONX_ModelComponentReferenceLink *)0x0;
      in_RSI->m_current_component_sn = 0;
      src = &ON_ModelComponentReference::Empty;
      goto LAB_0046b830;
    }
    pSVar1 = ON_SerialNumberMap::FindSerialNumber
                       (&in_RSI->m_model->m_mcr_sn_map,in_RSI->m_prev_component_sn);
    if (pSVar1 == (SN_ELEMENT *)0x0) {
      link = (ONX_ModelComponentReferenceLink *)0x0;
    }
    else {
      link = (ONX_ModelComponentReferenceLink *)(pSVar1->m_value).m_u.ptr;
    }
    Internal_SetLink(in_RSI,link);
  }
  ON_ModelComponentWeakReference::ON_ModelComponentWeakReference
            ((ON_ModelComponentWeakReference *)this,&in_RSI->m_current_component_weak_ref);
  _Var3._M_pi = extraout_RDX_01;
LAB_0046b844:
  OVar4.m_wp.super___weak_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  OVar4.m_wp.super___weak_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentWeakReference)
         OVar4.m_wp.super___weak_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentWeakReference ONX_ModelComponentIterator::PreviousComponentWeakReference()
{
  if ( nullptr == m_list )
    return LastComponentReference();

  if ( nullptr == m_link )
    return ON_ModelComponentReference::Empty;

  if (m_model_content_version == m_model->ModelContentVersionNumber() && nullptr != m_link )
  {
    m_link = m_link->m_prev;
    if (nullptr == m_link)
    {
      m_next_component_sn = m_current_component_sn;
      m_current_component_sn = 0;
      m_prev_component_sn = 0;
      m_current_component_weak_ref = ON_ModelComponentWeakReference::Empty;
    }
    else
    {
      m_current_component_sn = m_link->m_sn;
      m_next_component_sn = (nullptr != m_link->m_next) ? m_link->m_next->m_sn : 0;
      m_prev_component_sn = (nullptr != m_link->m_prev) ? m_link->m_prev->m_sn : 0;
      m_current_component_weak_ref = m_link->m_mcr;
    }
  }
  else if ( 0 != m_prev_component_sn )
  {
    Internal_SetLink(m_model->Internal_ModelComponentLinkFromSerialNumber(m_prev_component_sn));
  }
  else
  {
    m_link = nullptr;
    m_current_component_sn = 0;
    m_current_component_weak_ref = ON_ModelComponentReference::Empty;
  }

  return m_current_component_weak_ref;
}